

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O0

pint p_test_case_sha3_256_test(void)

{
  pint pVar1;
  puchar local_78 [8];
  puchar hash_etalon_3 [32];
  puchar hash_etalon_2 [32];
  puchar hash_etalon_1 [32];
  
  p_test_module_fail_counter = 0;
  hash_etalon_2[0x18] = ':';
  hash_etalon_2[0x19] = 0x98;
  hash_etalon_2[0x1a] = ']';
  hash_etalon_2[0x1b] = 0xa7;
  hash_etalon_2[0x1c] = 'O';
  hash_etalon_2[0x1d] = 0xe2;
  hash_etalon_2[0x1e] = '%';
  hash_etalon_2[0x1f] = 0xb2;
  hash_etalon_3[0x18] = 'A';
  hash_etalon_3[0x19] = 0xc0;
  hash_etalon_3[0x1a] = 0xdb;
  hash_etalon_3[0x1b] = 0xa2;
  hash_etalon_3[0x1c] = 0xa9;
  hash_etalon_3[0x1d] = 0xd6;
  hash_etalon_3[0x1e] = '$';
  hash_etalon_3[0x1f] = '\b';
  hash_etalon_2[0] = 'I';
  hash_etalon_2[1] = '\x10';
  hash_etalon_2[2] = '\x03';
  hash_etalon_2[3] = 'v';
  hash_etalon_2[4] = 0xa8;
  hash_etalon_2[5] = '#';
  hash_etalon_2[6] = '^';
  hash_etalon_2[7] = ',';
  hash_etalon_2[8] = 0x82;
  hash_etalon_2[9] = 0xe1;
  hash_etalon_2[10] = 0xb9;
  hash_etalon_2[0xb] = 0x99;
  hash_etalon_2[0xc] = 0x8a;
  hash_etalon_2[0xd] = 0x99;
  hash_etalon_2[0xe] = 0x9e;
  hash_etalon_2[0xf] = '!';
  hash_etalon_2[0x10] = 0xdb;
  hash_etalon_2[0x11] = '2';
  hash_etalon_2[0x12] = 0xdd;
  hash_etalon_2[0x13] = 0x97;
  hash_etalon_2[0x14] = 'I';
  hash_etalon_2[0x15] = 'm';
  hash_etalon_2[0x16] = '3';
  hash_etalon_2[0x17] = 'v';
  local_78[0] = '\\';
  local_78[1] = 0x88;
  local_78[2] = 'u';
  local_78[3] = 0xae;
  local_78[4] = 'G';
  local_78[5] = 'J';
  local_78[6] = '6';
  local_78[7] = '4';
  hash_etalon_3[0] = 0xba;
  hash_etalon_3[1] = 'O';
  hash_etalon_3[2] = 0xd5;
  hash_etalon_3[3] = '^';
  hash_etalon_3[4] = 200;
  hash_etalon_3[5] = '[';
  hash_etalon_3[6] = 0xff;
  hash_etalon_3[7] = 0xd6;
  hash_etalon_3[8] = 'a';
  hash_etalon_3[9] = 0xf3;
  hash_etalon_3[10] = '*';
  hash_etalon_3[0xb] = 0xca;
  hash_etalon_3[0xc] = 'u';
  hash_etalon_3[0xd] = 0xc6;
  hash_etalon_3[0xe] = 0xd6;
  hash_etalon_3[0xf] = 0x99;
  hash_etalon_3[0x10] = 0xd0;
  hash_etalon_3[0x11] = 0xcd;
  hash_etalon_3[0x12] = 0xcb;
  hash_etalon_3[0x13] = 'l';
  hash_etalon_3[0x14] = '\x11';
  hash_etalon_3[0x15] = 'X';
  hash_etalon_3[0x16] = 0x91;
  hash_etalon_3[0x17] = 0xc1;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA3_256,0x20,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",hash_etalon_2 + 0x18,
                    hash_etalon_3 + 0x18,local_78,
                    "3a985da74fe225b2045c172d6bd390bd855f086e3e9d525b46bfe24511431532",
                    "41c0dba2a9d6240849100376a8235e2c82e1b9998a999e21db32dd97496d3376",
                    "5c8875ae474a3634ba4fd55ec85bffd661f32aca75c6d699d0cdcb6c115891c1",
                    "e37ed9f31da3d61740e04c3124a2da5dbe8be0a2ef5c8b5932d45eb1958219e2");
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (sha3_256_test)
{
	const puchar	hash_etalon_1[] = { 58, 152,  93, 167,  79, 226,  37, 178,
					     4,  92,  23,  45, 107, 211, 144, 189,
					   133,  95,   8, 110,  62, 157,  82,  91,
					    70, 191, 226,  69,  17,  67,  21,  50};
	const puchar	hash_etalon_2[] = { 65, 192, 219, 162, 169, 214,  36,   8,
					    73,  16,   3, 118, 168,  35,  94,  44,
					   130, 225, 185, 153, 138, 153, 158,  33,
					   219,  50, 221, 151,  73, 109,  51, 118};
	const puchar	hash_etalon_3[] = { 92, 136, 117, 174,  71,  74,  54,  52,
					   186,  79, 213,  94, 200,  91, 255, 214,
					    97, 243,  42, 202, 117, 198, 214, 153,
					   208, 205, 203, 108,  17,  88, 145, 193};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA3_256,
			   32,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "3a985da74fe225b2045c172d6bd390bd855f086e3e9d525b46bfe24511431532",
			   "41c0dba2a9d6240849100376a8235e2c82e1b9998a999e21db32dd97496d3376",
			   "5c8875ae474a3634ba4fd55ec85bffd661f32aca75c6d699d0cdcb6c115891c1",
			   "e37ed9f31da3d61740e04c3124a2da5dbe8be0a2ef5c8b5932d45eb1958219e2");

	p_libsys_shutdown ();
}